

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O2

XML_Error externalParEntInitProcessor(XML_Parser parser,char *s,char *end,char **nextPtr)

{
  XML_Error XVar1;
  
  XVar1 = initializeEncoding(parser);
  if (XVar1 != XML_ERROR_NONE) {
    return XVar1;
  }
  parser->m_dtd->paramEntityRead = '\x01';
  if ((parser->m_prologState).inEntityValue != 0) {
    parser->m_processor = entityValueInitProcessor;
    XVar1 = entityValueInitProcessor(parser,s,end,nextPtr);
    return XVar1;
  }
  parser->m_processor = externalParEntProcessor;
  XVar1 = externalParEntProcessor(parser,s,end,nextPtr);
  return XVar1;
}

Assistant:

static enum XML_Error PTRCALL
externalParEntInitProcessor(XML_Parser parser, const char *s, const char *end,
                            const char **nextPtr) {
  enum XML_Error result = initializeEncoding(parser);
  if (result != XML_ERROR_NONE)
    return result;

  /* we know now that XML_Parse(Buffer) has been called,
     so we consider the external parameter entity read */
  parser->m_dtd->paramEntityRead = XML_TRUE;

  if (parser->m_prologState.inEntityValue) {
    parser->m_processor = entityValueInitProcessor;
    return entityValueInitProcessor(parser, s, end, nextPtr);
  } else {
    parser->m_processor = externalParEntProcessor;
    return externalParEntProcessor(parser, s, end, nextPtr);
  }
}